

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableLayout.cpp
# Opt level: O0

void __thiscall KDReports::TableLayout::updateRowHeight(TableLayout *this)

{
  double *pdVar1;
  double dVar2;
  qreal qVar3;
  undefined1 local_40 [8];
  double local_38;
  qreal vHeaderHeight;
  undefined1 local_18 [16];
  TableLayout *this_local;
  
  if (this->m_fixedRowHeight <= 0.0) {
    local_18._8_8_ = this;
    FontScaler::fontMetrics((FontScaler *)local_18);
    dVar2 = (double)QFontMetricsF::height();
    qVar3 = scaledCellPadding(this);
    this->m_rowHeight = qVar3 + qVar3 + dVar2;
    QFontMetricsF::~QFontMetricsF((QFontMetricsF *)local_18);
    if ((this->m_horizontalHeaderVisible & 1U) != 0) {
      FontScaler::fontMetrics((FontScaler *)&vHeaderHeight);
      dVar2 = (double)QFontMetricsF::height();
      qVar3 = scaledCellPadding(this);
      this->m_hHeaderHeight = qVar3 + qVar3 + dVar2;
      QFontMetricsF::~QFontMetricsF((QFontMetricsF *)&vHeaderHeight);
    }
    if ((this->m_verticalHeaderVisible & 1U) != 0) {
      FontScaler::fontMetrics((FontScaler *)local_40);
      dVar2 = (double)QFontMetricsF::height();
      qVar3 = scaledCellPadding(this);
      QFontMetricsF::~QFontMetricsF((QFontMetricsF *)local_40);
      local_38 = qVar3 + qVar3 + dVar2;
      pdVar1 = qMax<double>(&this->m_rowHeight,&local_38);
      this->m_rowHeight = *pdVar1;
    }
  }
  else {
    this->m_rowHeight = this->m_fixedRowHeight;
  }
  return;
}

Assistant:

void TableLayout::updateRowHeight()
{
    if (m_fixedRowHeight > 0) {
        m_rowHeight = m_fixedRowHeight;
        return;
    }
    m_rowHeight = m_cellFontScaler.fontMetrics().height() + 2.0 * scaledCellPadding();
    if (m_horizontalHeaderVisible) {
        m_hHeaderHeight = m_horizontalHeaderFontScaler.fontMetrics().height() + 2.0 * scaledCellPadding();
    }
    if (m_verticalHeaderVisible) {
        qreal vHeaderHeight = m_verticalHeaderFontScaler.fontMetrics().height() + 2.0 * scaledCellPadding();
#ifdef DEBUG_LAYOUT
        qDebug() << "cells say rowHeight=" << m_rowHeight << "vHeader says height=" << vHeaderHeight;
#endif
        m_rowHeight = qMax(m_rowHeight, vHeaderHeight);
    }
}